

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void populate_token_count
               (AV1_COMP *cpi,TileInfo *tile_info,int tile_row,int tile_col,int mi_row,
               TokenExtra *tok)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int num_mb_rows_in_sb;
  int tile_mb_cols;
  int sb_row_in_tile;
  TokenList *tplist;
  int num_planes;
  AV1_COMMON *cm;
  TokenInfo *token_info;
  
  _Var2 = is_token_info_allocated((TokenInfo *)(in_RDI + 0x71328));
  if (_Var2) {
    av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    lVar1 = *(long *)(in_RDI + 0x79330 + (long)in_EDX * 0x200 + (long)in_ECX * 8);
    iVar3 = in_R8D - *in_RSI >> ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x24) & 0x1f);
    *(int *)(lVar1 + (long)iVar3 * 0x10 + 8) =
         in_R9D - (int)*(undefined8 *)(lVar1 + (long)iVar3 * 0x10);
  }
  return;
}

Assistant:

static inline void populate_token_count(AV1_COMP *cpi,
                                        const TileInfo *tile_info, int tile_row,
                                        int tile_col, int mi_row,
                                        TokenExtra *tok) {
  const TokenInfo *token_info = &cpi->token_info;
  if (!is_token_info_allocated(token_info)) return;

  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  TokenList *const tplist = token_info->tplist[tile_row][tile_col];
  const int sb_row_in_tile =
      (mi_row - tile_info->mi_row_start) >> cm->seq_params->mib_size_log2;
  const int tile_mb_cols =
      (tile_info->mi_col_end - tile_info->mi_col_start + 2) >> 2;
  const int num_mb_rows_in_sb =
      ((1 << (cm->seq_params->mib_size_log2 + MI_SIZE_LOG2)) + 8) >> 4;
  tplist[sb_row_in_tile].count =
      (unsigned int)(tok - tplist[sb_row_in_tile].start);

  assert((unsigned int)(tok - tplist[sb_row_in_tile].start) <=
         get_token_alloc(num_mb_rows_in_sb, tile_mb_cols,
                         cm->seq_params->mib_size_log2 + MI_SIZE_LOG2,
                         num_planes));

  (void)num_planes;
  (void)tile_mb_cols;
  (void)num_mb_rows_in_sb;
}